

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FlipEdgeEvent(Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *t,Point *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Edge *pEVar5;
  bool bVar6;
  Orientation o;
  Triangle *this_00;
  Point *pd;
  Point *pb;
  Point *pc;
  Point *pPVar7;
  
  do {
    this_00 = Triangle::NeighborAcross(t,p);
    pd = Triangle::OppositePoint(this_00,t,p);
    pb = Triangle::PointCCW(t,p);
    pc = Triangle::PointCW(t,p);
    pPVar7 = p;
    bVar6 = InScanArea(p,pb,pc,pd);
    if (!bVar6) {
      pPVar7 = NextFlipPoint((Sweep *)pPVar7,ep,eq,this_00,pd);
      FlipScanEdgeEvent(this,tcx,ep,eq,t,this_00,pPVar7);
      EdgeEvent(this,tcx,ep,eq,t,p);
      return;
    }
    RotateTrianglePair((Sweep *)pPVar7,t,p,this_00,pd);
    SweepContext::MapTriangleToNodes(tcx,t);
    SweepContext::MapTriangleToNodes(tcx,this_00);
    dVar1 = eq->x;
    if ((p->x == dVar1) && (!NAN(p->x) && !NAN(dVar1))) {
      dVar2 = eq->y;
      if ((p->y == dVar2) && (!NAN(p->y) && !NAN(dVar2))) {
        dVar3 = ep->x;
        if ((pd->x == dVar3) && (!NAN(pd->x) && !NAN(dVar3))) {
          dVar4 = ep->y;
          if ((pd->y == dVar4) && (!NAN(pd->y) && !NAN(dVar4))) {
            pEVar5 = (tcx->edge_event).constrained_edge;
            pPVar7 = pEVar5->q;
            if ((((dVar1 == pPVar7->x) && (!NAN(dVar1) && !NAN(pPVar7->x))) && (dVar2 == pPVar7->y))
               && (!NAN(dVar2) && !NAN(pPVar7->y))) {
              pPVar7 = pEVar5->p;
              if (((dVar3 == pPVar7->x) && (!NAN(dVar3) && !NAN(pPVar7->x))) &&
                 ((dVar4 == pPVar7->y && (!NAN(dVar4) && !NAN(pPVar7->y))))) {
                Triangle::MarkConstrainedEdge(t,ep,eq);
                Triangle::MarkConstrainedEdge(this_00,ep,eq);
                Legalize(this,tcx,t);
                Legalize(this,tcx,this_00);
                return;
              }
            }
            return;
          }
        }
      }
    }
    o = Orient2d(eq,pd,ep);
    t = NextFlipTriangle(this,tcx,o,t,this_00,p,pd);
  } while( true );
}

Assistant:

void Sweep::FlipEdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* t, Point& p)
{
  Triangle& ot = t->NeighborAcross(p);
  Point& op = *ot.OppositePoint(*t, p);

  if (InScanArea(p, *t->PointCCW(p), *t->PointCW(p), op)) {
    // Lets rotate shared edge one vertex CW
    RotateTrianglePair(*t, p, ot, op);
    tcx.MapTriangleToNodes(*t);
    tcx.MapTriangleToNodes(ot);

    if (p == eq && op == ep) {
      if (eq == *tcx.edge_event.constrained_edge->q && ep == *tcx.edge_event.constrained_edge->p) {
        t->MarkConstrainedEdge(&ep, &eq);
        ot.MarkConstrainedEdge(&ep, &eq);
        Legalize(tcx, *t);
        Legalize(tcx, ot);
      } else {
        // XXX: I think one of the triangles should be legalized here?
      }
    } else {
      Orientation o = Orient2d(eq, op, ep);
      t = &NextFlipTriangle(tcx, (int)o, *t, ot, p, op);
      FlipEdgeEvent(tcx, ep, eq, t, p);
    }
  } else {
    Point& newP = NextFlipPoint(ep, eq, ot, op);
    FlipScanEdgeEvent(tcx, ep, eq, *t, ot, newP);
    EdgeEvent(tcx, ep, eq, t, p);
  }
}